

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int16_t iVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  HopcroftKarpAlgorithm *this;
  HopcroftKarpAlgorithm boxNestingAlgorithm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  istream *in_stack_00000488;
  char *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  reference in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffec8;
  char **in_stack_fffffffffffffed0;
  vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *in_stack_fffffffffffffed8;
  HopcroftKarpAlgorithm *in_stack_fffffffffffffee0;
  HopcroftKarpAlgorithm *in_stack_ffffffffffffff50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  int local_4;
  
  local_4 = 0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x105d3a);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffee0,(char **)in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x105d6e);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_28);
  if (sVar3 < 2) {
    BoxNesting::Parser::getBoxes(in_stack_00000488);
    BoxNesting::HopcroftKarpAlgorithm::HopcroftKarpAlgorithm
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::~vector
              ((vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *)
               in_stack_fffffffffffffeb0);
    iVar2 = BoxNesting::HopcroftKarpAlgorithm::runAlgorithm(in_stack_ffffffffffffff50);
    this = (HopcroftKarpAlgorithm *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    BoxNesting::HopcroftKarpAlgorithm::~HopcroftKarpAlgorithm(this);
    goto LAB_001060bc;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
  bVar1 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (bVar1) {
LAB_00105e05:
    printVersion();
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
    bVar1 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (bVar1) goto LAB_00105e05;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
    bVar1 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
      bVar1 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"unknown options: \"");
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
        poVar4 = std::operator<<(poVar4,(string *)pvVar5);
        poVar4 = std::operator<<(poVar4,"\"");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        in_stack_fffffffffffffeb0 =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
        printHelp((string *)0x105f9b);
        local_4 = 1;
        goto LAB_001060bc;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
    printHelp((string *)0x105ee6);
  }
  local_4 = 0;
LAB_001060bc:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffeb0);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
	// Because ptr arithmatic is not allowed but we need it here
	// to access program arguments we exclude no lint here
	std::vector<std::string> arguments(argv, argv + argc); // NOLINT

	if (arguments.size() >= 2) {
		if (arguments.at(1) == "--version" || arguments.at(1) == "-v") {
			printVersion();
		} else if (arguments.at(1) == "--help" || arguments.at(1) == "-h") {
			printHelp(arguments.at(0));
		} else {
			std::cout << "unknown options: \"" << arguments.at(1) << "\"" << std::endl << std::endl;
			printHelp(arguments.at(0));
			return EXIT_FAILURE;
		}
		return EXIT_SUCCESS;
	}

	BoxNesting::HopcroftKarpAlgorithm boxNestingAlgorithm(BoxNesting::Parser::getBoxes(std::cin));

	std::cout << boxNestingAlgorithm.runAlgorithm() << std::endl;

	return EXIT_SUCCESS;
}